

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

void __thiscall MPL::detail::ModelPackageImpl::removeItem(ModelPackageImpl *this,string *identifier)

{
  int iVar1;
  runtime_error *prVar2;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  path path;
  string local_c0;
  _Alloc_hider local_a0;
  undefined1 local_98 [40];
  string local_70;
  path local_50;
  
  getItemInfoEntry((ModelPackageImpl *)&local_a0,(string *)this);
  if ((JsonMap *)local_a0._M_p == (JsonMap *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   "Failed to look up file with identifier: ",identifier);
    std::runtime_error::runtime_error(prVar2,(string *)local_98);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"path","");
  JsonMap::getString(&local_c0,(JsonMap *)local_a0._M_p,&local_70);
  std::filesystem::__cxx11::path::path(&local_50,&local_c0,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_98,&this->m_packageDataDirPath,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._0_8_ + 1);
  }
  iVar1 = remove((char *)local_98._0_8_);
  if (iVar1 == 0) {
    removeItemInfoEntry(this,identifier);
    std::filesystem::__cxx11::path::~path((path *)local_98);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)&local_a0);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,local_98._0_8_,(char *)(local_98._0_8_ + local_98._8_8_));
  std::operator+(&local_50._M_pathname,"Failed to remove file at path: ",&local_c0);
  std::runtime_error::runtime_error(prVar2,(string *)&local_50);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::removeItem(const std::string& identifier)
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        throw std::runtime_error("Failed to look up file with identifier: " + identifier);
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    if (0 != std::remove(path.c_str())) {
        throw std::runtime_error("Failed to remove file at path: " + path.string());
    }
    
    removeItemInfoEntry(identifier);
}